

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int __thiscall glslang::TIntermediate::addXfbBufferOffset(TIntermediate *this,TType *type)

{
  bool *contains16BitType;
  pointer pTVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ulong uVar5;
  TRange *pTVar6;
  uint uVar7;
  long lVar8;
  TRange *pTVar9;
  TRange *pTVar10;
  bool bVar11;
  TRange range;
  long lVar4;
  
  iVar2 = (*type->_vptr_TType[0xb])(type);
  lVar4 = CONCAT44(extraout_var,iVar2);
  uVar7 = (uint)*(undefined8 *)(lVar4 + 0x24);
  if (((~uVar7 & 0x7ffc0000) != 0) && (uVar5 = (ulong)(uVar7 & 0xf), uVar5 != 0xf)) {
    pTVar1 = (this->xfbBuffers).
             super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
             super__Vector_impl_data._M_start;
    contains16BitType = &pTVar1[uVar5].contains16BitType;
    uVar3 = computeTypeXfbSize(this,type,&pTVar1[uVar5].contains64BitType,
                               &pTVar1[uVar5].contains32BitType,contains16BitType);
    uVar7 = (*(uint *)(lVar4 + 0x24) >> 0x12 & 0x1fff) + uVar3;
    if (uVar7 < *(uint *)(contains16BitType + -6)) {
      uVar7 = *(uint *)(contains16BitType + -6);
    }
    *(uint *)(contains16BitType + -6) = uVar7;
    range.start = *(uint *)(lVar4 + 0x24) >> 0x12 & 0x1fff;
    range.last = uVar3 + range.start + -1;
    lVar4 = *(long *)&(((TXfbBuffer *)(contains16BitType + -0x22))->ranges).
                      super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl;
    lVar8 = (long)*(pointer *)(contains16BitType + -0x1a) - lVar4 >> 3;
    pTVar10 = (TRange *)(lVar4 + -8);
    do {
      pTVar9 = pTVar10;
      bVar11 = lVar8 == 0;
      lVar8 = lVar8 + -1;
      if (bVar11) {
        std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::push_back
                  (&pTVar1[uVar5].ranges,&range);
        return -1;
      }
      pTVar10 = pTVar9 + 1;
    } while ((range.last < pTVar9[1].start) || (pTVar9[1].last < range.start));
    pTVar6 = &range;
    if (range.start < pTVar9[1].start) {
      pTVar6 = pTVar10;
    }
    return pTVar6->start;
  }
  __assert_fail("qualifier.hasXfbOffset() && qualifier.hasXfbBuffer()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                ,0x80a,"int glslang::TIntermediate::addXfbBufferOffset(const TType &)");
}

Assistant:

int TIntermediate::addXfbBufferOffset(const TType& type)
{
    const TQualifier& qualifier = type.getQualifier();

    assert(qualifier.hasXfbOffset() && qualifier.hasXfbBuffer());
    TXfbBuffer& buffer = xfbBuffers[qualifier.layoutXfbBuffer];

    // compute the range
    unsigned int size = computeTypeXfbSize(type, buffer.contains64BitType, buffer.contains32BitType, buffer.contains16BitType);
    buffer.implicitStride = std::max(buffer.implicitStride, qualifier.layoutXfbOffset + size);
    TRange range(qualifier.layoutXfbOffset, qualifier.layoutXfbOffset + size - 1);

    // check for collisions
    for (size_t r = 0; r < buffer.ranges.size(); ++r) {
        if (range.overlap(buffer.ranges[r])) {
            // there is a collision; pick an example to return
            return std::max(range.start, buffer.ranges[r].start);
        }
    }

    buffer.ranges.push_back(range);

    return -1;  // no collision
}